

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O0

void packforblock23(uint32_t base,uint32_t **pin,uint8_t **pw)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  uint32_t uVar22;
  uint32_t uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  uint32_t uVar31;
  uint32_t uVar32;
  uint32_t uVar33;
  uint32_t uVar34;
  uint32_t uVar35;
  uint32_t uVar36;
  uint32_t uVar37;
  uint32_t uVar38;
  uint32_t uVar39;
  uint32_t uVar40;
  ulong *puVar41;
  uint32_t *puVar42;
  uint64_t w11;
  uint64_t w10;
  uint64_t w9;
  uint64_t w8;
  uint64_t w7;
  uint64_t w6;
  uint64_t w5;
  uint64_t w4;
  uint64_t w3;
  uint64_t w2;
  uint64_t w1;
  uint64_t w0;
  uint32_t *in;
  uint64_t *pw64;
  uint8_t **pw_local;
  uint32_t **pin_local;
  
  puVar41 = (ulong *)*pw;
  puVar42 = *pin;
  uVar1 = puVar42[2];
  uVar2 = puVar42[3];
  uVar3 = puVar42[4];
  uVar4 = puVar42[5];
  uVar5 = puVar42[5];
  uVar6 = puVar42[6];
  uVar7 = puVar42[7];
  uVar8 = puVar42[8];
  uVar9 = puVar42[8];
  uVar10 = puVar42[9];
  uVar11 = puVar42[10];
  uVar12 = puVar42[0xb];
  uVar13 = puVar42[0xb];
  uVar14 = puVar42[0xc];
  uVar15 = puVar42[0xd];
  uVar16 = puVar42[0xd];
  uVar17 = puVar42[0xe];
  uVar18 = puVar42[0xf];
  uVar19 = puVar42[0x10];
  uVar20 = puVar42[0x10];
  uVar21 = puVar42[0x11];
  uVar22 = puVar42[0x12];
  uVar23 = puVar42[0x13];
  uVar24 = puVar42[0x13];
  uVar25 = puVar42[0x14];
  uVar26 = puVar42[0x15];
  uVar27 = puVar42[0x16];
  uVar28 = puVar42[0x16];
  uVar29 = puVar42[0x17];
  uVar30 = puVar42[0x18];
  uVar31 = puVar42[0x19];
  uVar32 = puVar42[0x19];
  uVar33 = puVar42[0x1a];
  uVar34 = puVar42[0x1b];
  uVar35 = puVar42[0x1b];
  uVar36 = puVar42[0x1c];
  uVar37 = puVar42[0x1d];
  uVar38 = puVar42[0x1e];
  uVar39 = puVar42[0x1e];
  uVar40 = puVar42[0x1f];
  *puVar41 = (ulong)(puVar42[2] - base) << 0x2e |
             (ulong)(puVar42[1] - base) << 0x17 | (ulong)(*puVar42 - base);
  puVar41[1] = (ulong)(uVar4 - base) << 0x33 |
               (ulong)(uVar3 - base) << 0x1c |
               (ulong)(uVar2 - base) << 5 | (ulong)(uVar1 - base >> 0x12);
  puVar41[2] = (ulong)(uVar8 - base) << 0x38 |
               (ulong)(uVar7 - base) << 0x21 |
               (ulong)(uVar6 - base) << 10 | (ulong)(uVar5 - base >> 0xd);
  puVar41[3] = (ulong)(uVar12 - base) << 0x3d |
               (ulong)(uVar11 - base) << 0x26 |
               (ulong)(uVar10 - base) << 0xf | (ulong)(uVar9 - base >> 8);
  puVar41[4] = (ulong)(uVar15 - base) << 0x2b |
               (ulong)(uVar14 - base) << 0x14 | (ulong)(uVar13 - base >> 3);
  puVar41[5] = (ulong)(uVar19 - base) << 0x30 |
               (ulong)(uVar18 - base) << 0x19 |
               (ulong)(uVar17 - base) << 2 | (ulong)(uVar16 - base >> 0x15);
  puVar41[6] = (ulong)(uVar23 - base) << 0x35 |
               (ulong)(uVar22 - base) << 0x1e |
               (ulong)(uVar21 - base) << 7 | (ulong)(uVar20 - base >> 0x10);
  puVar41[7] = (ulong)(uVar27 - base) << 0x3a |
               (ulong)(uVar26 - base) << 0x23 |
               (ulong)(uVar25 - base) << 0xc | (ulong)(uVar24 - base >> 0xb);
  puVar41[8] = (ulong)(uVar31 - base) << 0x3f |
               (ulong)(uVar30 - base) << 0x28 |
               (ulong)(uVar29 - base) << 0x11 | (ulong)(uVar28 - base >> 6);
  puVar41[9] = (ulong)(uVar34 - base) << 0x2d |
               (ulong)(uVar33 - base) << 0x16 | (ulong)(uVar32 - base >> 1);
  puVar41[10] = (ulong)(uVar38 - base) << 0x32 |
                (ulong)(uVar37 - base) << 0x1b |
                (ulong)(uVar36 - base) << 4 | (ulong)(uVar35 - base >> 0x13);
  puVar41[0xb] = (ulong)(uVar40 - base) << 9 | (ulong)(uVar39 - base >> 0xe);
  *pin = *pin + 0x20;
  *pw = *pw + 0x5c;
  return;
}

Assistant:

static void packforblock23(const uint32_t base, const uint32_t **pin,
                           uint8_t **pw) {
  uint64_t *pw64 = *(uint64_t **)pw;
  const uint32_t *in = *pin;
  /* we are going to touch  12 64-bit words */
  uint64_t w0;
  uint64_t w1;
  uint64_t w2;
  uint64_t w3;
  uint64_t w4;
  uint64_t w5;
  uint64_t w6;
  uint64_t w7;
  uint64_t w8;
  uint64_t w9;
  uint64_t w10;
  uint64_t w11;
  w0 = (uint64_t)(in[0] - base);
  w0 |= (uint64_t)(in[1] - base) << 23;
  w0 |= (uint64_t)(in[2] - base) << 46;
  w1 = (uint64_t)(in[2] - base) >> 18;
  w1 |= (uint64_t)(in[3] - base) << 5;
  w1 |= (uint64_t)(in[4] - base) << 28;
  w1 |= (uint64_t)(in[5] - base) << 51;
  w2 = (uint64_t)(in[5] - base) >> 13;
  w2 |= (uint64_t)(in[6] - base) << 10;
  w2 |= (uint64_t)(in[7] - base) << 33;
  w2 |= (uint64_t)(in[8] - base) << 56;
  w3 = (uint64_t)(in[8] - base) >> 8;
  w3 |= (uint64_t)(in[9] - base) << 15;
  w3 |= (uint64_t)(in[10] - base) << 38;
  w3 |= (uint64_t)(in[11] - base) << 61;
  w4 = (uint64_t)(in[11] - base) >> 3;
  w4 |= (uint64_t)(in[12] - base) << 20;
  w4 |= (uint64_t)(in[13] - base) << 43;
  w5 = (uint64_t)(in[13] - base) >> 21;
  w5 |= (uint64_t)(in[14] - base) << 2;
  w5 |= (uint64_t)(in[15] - base) << 25;
  w5 |= (uint64_t)(in[16] - base) << 48;
  w6 = (uint64_t)(in[16] - base) >> 16;
  w6 |= (uint64_t)(in[17] - base) << 7;
  w6 |= (uint64_t)(in[18] - base) << 30;
  w6 |= (uint64_t)(in[19] - base) << 53;
  w7 = (uint64_t)(in[19] - base) >> 11;
  w7 |= (uint64_t)(in[20] - base) << 12;
  w7 |= (uint64_t)(in[21] - base) << 35;
  w7 |= (uint64_t)(in[22] - base) << 58;
  w8 = (uint64_t)(in[22] - base) >> 6;
  w8 |= (uint64_t)(in[23] - base) << 17;
  w8 |= (uint64_t)(in[24] - base) << 40;
  w8 |= (uint64_t)(in[25] - base) << 63;
  w9 = (uint64_t)(in[25] - base) >> 1;
  w9 |= (uint64_t)(in[26] - base) << 22;
  w9 |= (uint64_t)(in[27] - base) << 45;
  w10 = (uint64_t)(in[27] - base) >> 19;
  w10 |= (uint64_t)(in[28] - base) << 4;
  w10 |= (uint64_t)(in[29] - base) << 27;
  w10 |= (uint64_t)(in[30] - base) << 50;
  w11 = (uint64_t)(in[30] - base) >> 14;
  w11 |= (uint64_t)(in[31] - base) << 9;
  pw64[0] = w0;
  pw64[1] = w1;
  pw64[2] = w2;
  pw64[3] = w3;
  pw64[4] = w4;
  pw64[5] = w5;
  pw64[6] = w6;
  pw64[7] = w7;
  pw64[8] = w8;
  pw64[9] = w9;
  pw64[10] = w10;
  pw64[11] = w11;
  *pin += 32; /* we consumed 32 32-bit integers */
  *pw += 92;  /* we used up 92 output bytes */
}